

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O2

void __thiscall mocker::detail::InterferenceGraph::combine(InterferenceGraph *this,Node *v,Node *u)

{
  bool bVar1;
  iterator __it;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  mapped_type *pmVar3;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_58;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_48;
  
  bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                    (&this->freeze,v);
  this_00 = &(this->highDegree)._M_h;
  if (bVar1) {
    this_00 = &(this->freeze)._M_h;
  }
  __it = std::
         _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
         ::find(this_00,v);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::erase(this_00,(const_iterator)
                  __it.super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>.
                  _M_cur);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_M_emplace<std::shared_ptr<mocker::nasm::Register>const&>
            ((_Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->coalesced,v);
  p_Var2 = &std::__detail::
            _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::at((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&this->alias,v)->
            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var2,&u->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>);
  getCurAdjList(&local_48,this,v);
  for (p_Var2 = &(local_48.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 != &(local_48.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,p_Var2);
    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,&u->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)
    ;
    addEdge(this,(Node *)&local_58,(Node *)&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    pmVar3 = std::__detail::
             _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&this->curDegree,(key_type *)p_Var2);
    *pmVar3 = *pmVar3 - 1;
  }
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector(&local_48);
  bVar1 = isPrecolored(u);
  if (!bVar1) {
    classifyNode(this,u);
  }
  return;
}

Assistant:

void InterferenceGraph::combine(const Node &v, const Node &u) {
  if (isIn(freeze, v))
    freeze.erase(freeze.find(v));
  else
    highDegree.erase(highDegree.find(v));
  coalesced.emplace(v);
  alias.at(v) = u;
  // The associated moves are handle externally

  for (auto &t : getCurAdjList(v)) {
    // Note that we do not remove node v explicitly. Hence, we have to
    // decrement the degree of t manually.
    addEdge(t, u);
    curDegree.at(t)--;

    // Do not use decrementDegree here since it may trigger some unnecessary
    // task if the original degree of t is K
    //    if (!isPrecolored(t))
    //      classifyNode(t);
    //    decrementDegree(t);
  }
  if (!isPrecolored(u))
    classifyNode(u);
}